

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

Promise<void> kj::yield(void)

{
  int iVar1;
  PromiseBase in_RDI;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_18 [2];
  
  if (yield()::NODE == '\0') {
    iVar1 = __cxa_guard_acquire(&yield()::NODE);
    if (iVar1 != 0) {
      __cxa_atexit(yield::YieldPromiseNode::~YieldPromiseNode,&yield::NODE,&__dso_handle);
      __cxa_guard_release(&yield()::NODE);
    }
  }
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::Own(local_18,&yield::NODE.super_PromiseNode);
  _::PromiseNode::to<kj::Promise<void>>((PromiseNode *)in_RDI.node.ptr,local_18);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::~Own(local_18);
  return (Promise<void>)(PromiseNode *)in_RDI.node.ptr;
}

Assistant:

Promise<void> yield() {
  class YieldPromiseNode final: public _::PromiseNode {
  public:
    void destroy() override {}

    void onReady(_::Event* event) noexcept override {
      if (event) event->armBreadthFirst();
    }
    void get(_::ExceptionOrValue& output) noexcept override {
      output.as<_::Void>() = _::Void();
    }
    void tracePromise(_::TraceBuilder& builder, bool stopAtNextEvent) override {
      builder.add(reinterpret_cast<void*>(&kj::yield));
    }
  };

  static YieldPromiseNode NODE;
  return _::PromiseNode::to<Promise<void>>(_::OwnPromiseNode(&NODE));
}